

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall duckdb_re2::Compiler::Match(Compiler *this,int32_t match_id)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  Frag FVar4;
  uint uStack_2c;
  
  uVar2 = AllocInst(this,1);
  if ((int)uVar2 < 0) {
    uVar3 = 0;
  }
  else {
    Prog::Inst::InitMatch
              ((this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar2,match_id
              );
    uVar3 = (ulong)uVar2;
  }
  uStack_2c = uStack_2c & 0xffffff00;
  lVar1 = (ulong)uStack_2c << 0x20;
  FVar4.end.tail = (int)lVar1;
  FVar4.nullable = (bool)(char)((ulong)lVar1 >> 0x20);
  FVar4._13_3_ = (int3)((ulong)lVar1 >> 0x28);
  FVar4.begin = (int)uVar3;
  FVar4.end.head = (int)(uVar3 >> 0x20);
  return FVar4;
}

Assistant:

Frag Compiler::Match(int32_t match_id) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitMatch(match_id);
  return Frag(id, kNullPatchList, false);
}